

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.cpp
# Opt level: O2

Vector __thiscall PCA::tc(PCA *this,Vector *f,Matrix *eigen)

{
  Scalar *pSVar1;
  Matrix<double,__1,__1,_1,__1,__1> *in_RCX;
  Index extraout_RDX;
  Index IVar2;
  Index extraout_RDX_00;
  uint i;
  ulong i_00;
  ReturnType RVar3;
  Vector VVar4;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>> local_68 [56];
  
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(uint *)f);
  IVar2 = extraout_RDX;
  for (i_00 = 0;
      i_00 < *(uint *)&(f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data; i_00 = i_00 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_68,in_RCX,i_00
              );
    RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,-1,1,false>>::
            dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                      (local_68,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)eigen);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,i_00);
    *pSVar1 = RVar3;
    IVar2 = extraout_RDX_00;
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar2;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector PCA::tc(Vector &f, Matrix &eigen) {
	Vector res = Vector(alpha);

	for(unsigned int i = 0; i < alpha; i++)
		res(i) = eigen.col(i).dot(f);

	return res;
}